

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.cc
# Opt level: O3

shared_ptr<spdlog::logger> * lf::uscalfe::ScalarLoadElementVectorProviderLogger(void)

{
  int iVar1;
  string local_30;
  
  if (ScalarLoadElementVectorProviderLogger()::logger == '\0') {
    iVar1 = __cxa_guard_acquire(&ScalarLoadElementVectorProviderLogger()::logger);
    if (iVar1 != 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"lf::uscalfe::ScalarLoadElementVectorProviderLogger","");
      base::InitLogger((base *)&ScalarLoadElementVectorProviderLogger::logger,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &ScalarLoadElementVectorProviderLogger::logger,&__dso_handle);
      __cxa_guard_release(&ScalarLoadElementVectorProviderLogger()::logger);
    }
  }
  return &ScalarLoadElementVectorProviderLogger::logger;
}

Assistant:

std::shared_ptr<spdlog::logger>& ScalarLoadElementVectorProviderLogger() {
  static auto logger =
      base::InitLogger("lf::uscalfe::ScalarLoadElementVectorProviderLogger");
  return logger;
}